

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.c
# Opt level: O0

Graph * raviX_init_graph(nodeId_t entry,nodeId_t exit,void *userdata,
                        C_MemoryAllocator *node_allocator)

{
  Graph *g_00;
  Graph *g;
  C_MemoryAllocator *node_allocator_local;
  void *userdata_local;
  nodeId_t exit_local;
  nodeId_t entry_local;
  
  g_00 = (Graph *)raviX_calloc(1,0x28);
  g_00->allocated = 0;
  g_00->nodes = (GraphNode **)0x0;
  g_00->node_allocator = node_allocator;
  raviX_add_node(g_00,entry);
  raviX_add_node(g_00,exit);
  g_00->entry = entry;
  g_00->exit = exit;
  g_00->userdata = userdata;
  return g_00;
}

Assistant:

Graph *raviX_init_graph(nodeId_t entry, nodeId_t exit, void *userdata, C_MemoryAllocator *node_allocator)
{
	Graph *g = (Graph *)raviX_calloc(1, sizeof(Graph));
	g->allocated = 0;
	g->nodes = NULL;
	g->node_allocator = node_allocator;
	raviX_add_node(g, entry);
	raviX_add_node(g, exit);
	g->entry = entry;
	g->exit = exit;
	g->userdata = userdata;
	return g;
}